

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboColorbufferTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::FboColorTex2DArrayCase::render(FboColorTex2DArrayCase *this,Surface *dst)

{
  ulong uVar1;
  bool bVar2;
  deUint32 dVar3;
  DataType DVar4;
  deUint32 program;
  deUint32 program_00;
  int iVar5;
  int iVar6;
  int depth;
  char *str;
  DataTypes *samplerTypes;
  Context *pCVar7;
  TransferFormat TVar8;
  undefined1 *this_00;
  int *piVar9;
  size_type sVar10;
  deUint32 *pdVar11;
  reference pvVar12;
  void *data_00;
  ContextWrapper *this_01;
  Vector<float,_3> local_564;
  undefined1 local_558 [8];
  Vec3 p1;
  Vec3 p0;
  Vector<float,_3> local_534;
  PixelBufferAccess local_528;
  Vector<float,_4> local_500;
  Vec4 local_4f0;
  PixelBufferAccess local_4e0;
  TextureFormat local_4b8;
  undefined1 local_4b0 [8];
  TextureLevel data;
  IVec3 *viewport;
  deUint32 local_478;
  deUint32 fbo;
  deUint32 tmpTex;
  int texH;
  int texW;
  deUint32 dataType;
  deUint32 format;
  int layer;
  size_t ndx_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_450;
  value_type_conflict1 local_444;
  ulong local_440;
  size_t n;
  vector<int,_std::allocator<int>_> order;
  deUint32 layerFbo;
  int ndx;
  IVec3 *size;
  bool isFilterable;
  deUint32 local_3fc;
  deUint32 dStack_3f8;
  TransferFormat transferFmt;
  deUint32 tex;
  vector<unsigned_int,_std::allocator<unsigned_int>_> fbos;
  deUint32 arrayTexShaderID;
  deUint32 texToFboShaderID;
  undefined1 local_3c8 [8];
  Texture2DArrayShader arrayTexShader;
  DataTypes local_238;
  undefined1 local_218 [8];
  Texture2DShader texToFboShader;
  TextureFormatInfo fmtInfo;
  TextureFormat local_30;
  TextureFormat texFmt;
  Random rnd;
  Surface *dst_local;
  FboColorTex2DArrayCase *this_local;
  
  str = tcu::TestNode::getName((TestNode *)this);
  dVar3 = deStringHash(str);
  de::Random::Random((Random *)&texFmt,dVar3 ^ 0xed607a89);
  local_30 = glu::mapGLInternalFormat((this->super_FboColorbufferCase).m_format);
  tcu::getTextureFormatInfo((TextureFormatInfo *)&texToFboShader.field_0x194,&local_30);
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_238.vec.super__Vector_base<glu::DataType,_std::allocator<glu::DataType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  FboTestUtil::DataTypes::DataTypes(&local_238);
  samplerTypes = FboTestUtil::DataTypes::operator<<(&local_238,TYPE_SAMPLER_2D);
  DVar4 = FboTestUtil::getFragmentOutputType(&local_30);
  tcu::operator-((tcu *)&arrayTexShader.m_outputType,
                 (Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)&texToFboShader.field_0x194);
  FboTestUtil::Texture2DShader::Texture2DShader
            ((Texture2DShader *)local_218,samplerTypes,DVar4,(Vec4 *)&arrayTexShader.m_outputType,
             (Vec4 *)&texToFboShader.field_0x194);
  FboTestUtil::DataTypes::~DataTypes(&local_238);
  DVar4 = glu::getSampler2DArrayType(local_30);
  FboTestUtil::Texture2DArrayShader::Texture2DArrayShader
            ((Texture2DArrayShader *)local_3c8,DVar4,TYPE_FLOAT_VEC4);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program = (*pCVar7->_vptr_Context[0x75])(pCVar7,local_218);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  program_00 = (*pCVar7->_vptr_Context[0x75])(pCVar7,local_3c8);
  pCVar7 = sglr::ContextWrapper::getCurrentContext
                     (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestUtil::Texture2DShader::setUniforms((Texture2DShader *)local_218,pCVar7,program);
  FboTestUtil::Texture2DArrayShader::setTexScaleBias
            ((Texture2DArrayShader *)local_3c8,(Vec4 *)(fmtInfo.valueMax.m_data + 2),
             (Vec4 *)(fmtInfo.lookupScale.m_data + 2));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  TVar8 = glu::getTransferFormat(local_30);
  bVar2 = glu::isGLInternalColorFormatFilterable((this->super_FboColorbufferCase).m_format);
  this_00 = &(this->super_FboColorbufferCase).field_0x8c;
  sglr::ContextWrapper::glGenTextures
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
             &transferFmt.format);
  sglr::ContextWrapper::glBindTexture
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,
             transferFmt.format);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0x2802,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0x2803,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0x8072,
             0x812f);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0x2801,
             bVar2 | 0x2600);
  sglr::ContextWrapper::glTexParameteri
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0x2800,
             bVar2 | 0x2600);
  dVar3 = (this->super_FboColorbufferCase).m_format;
  iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)this_00);
  iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)this_00);
  depth = tcu::Vector<int,_3>::z((Vector<int,_3> *)this_00);
  local_3fc = TVar8.format;
  dStack_3f8 = TVar8.dataType;
  sglr::ContextWrapper::glTexImage3D
            (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,0,dVar3
             ,iVar5,iVar6,depth,0,local_3fc,dStack_3f8,(void *)0x0);
  order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  while( true ) {
    iVar5 = order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage._4_4_;
    piVar9 = tcu::Vector<int,_3>::z((Vector<int,_3> *)&(this->super_FboColorbufferCase).field_0x8c);
    if (*piVar9 <= iVar5) break;
    sglr::ContextWrapper::glGenFramebuffers
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,
               (deUint32 *)
               &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               (deUint32)
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage);
    sglr::ContextWrapper::glFramebufferTextureLayer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,
               0x8ce0,transferFmt.format,0,
               order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_end_of_storage._4_4_);
    FboTestCase::checkError((FboTestCase *)this);
    FboTestCase::checkFramebufferStatus((FboTestCase *)this,0x8d40);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType,
               (value_type_conflict4 *)
               &order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_end_of_storage);
    order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ =
         order.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage._4_4_ + 1;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&n);
  local_440 = 0;
  while( true ) {
    uVar1 = local_440;
    sVar10 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType
                       );
    if (sVar10 <= uVar1) break;
    local_444 = (value_type_conflict1)local_440;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&n,&local_444);
    local_440 = local_440 + 1;
  }
  local_450._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin((vector<int,_std::allocator<int>_> *)&n)
  ;
  ndx_1 = (size_t)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)&n);
  de::Random::shuffle<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((Random *)&texFmt,local_450,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)ndx_1);
  _format = 0;
  while( true ) {
    uVar1 = _format;
    sVar10 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&n);
    if (sVar10 <= uVar1) break;
    pdVar11 = (deUint32 *)
              std::vector<int,_std::allocator<int>_>::operator[]
                        ((vector<int,_std::allocator<int>_> *)&n,_format);
    dataType = *pdVar11;
    texW = 0x1908;
    texH = 0x1401;
    tmpTex = 0x80;
    fbo = 0x80;
    local_478 = 0;
    pvVar12 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &transferFmt.dataType,(long)(int)dataType);
    dVar3 = *pvVar12;
    data.m_data.m_cap = (size_t)&(this->super_FboColorbufferCase).field_0x8c;
    local_4b8 = glu::mapGLTransferFormat(0x1908,0x1401);
    tcu::TextureLevel::TextureLevel((TextureLevel *)local_4b0,&local_4b8,0x80,0x80,1);
    tcu::TextureLevel::getAccess(&local_4e0,(TextureLevel *)local_4b0);
    generateRandomColor((Functional *)&local_4f0,(Random *)&texFmt);
    tcu::Vector<float,_4>::Vector(&local_500,0.0);
    tcu::fillWithGrid(&local_4e0,8,&local_4f0,&local_500);
    sglr::ContextWrapper::glGenTextures
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,1,&local_478
              );
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,
               local_478);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2802
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2803
               ,0x812f);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2801
               ,0x2601);
    sglr::ContextWrapper::glTexParameteri
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0x2800
               ,0x2601);
    tcu::TextureLevel::getAccess(&local_528,(TextureLevel *)local_4b0);
    data_00 = tcu::PixelBufferAccess::getDataPtr(&local_528);
    sglr::ContextWrapper::glTexImage2D
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0xde1,0,
               0x1908,0x80,0x80,0,0x1908,0x1401,data_00);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,dVar3
              );
    iVar5 = tcu::Vector<int,_3>::x((Vector<int,_3> *)data.m_data.m_cap);
    iVar6 = tcu::Vector<int,_3>::y((Vector<int,_3> *)data.m_data.m_cap);
    sglr::ContextWrapper::glViewport
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0,0,iVar5,
               iVar6);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    tcu::Vector<float,_3>::Vector(&local_534,-1.0,-1.0,0.0);
    tcu::Vector<float,_3>::Vector((Vector<float,_3> *)(p0.m_data + 1),1.0,1.0,0.0);
    sglr::drawQuad(pCVar7,program,&local_534,(Vec3 *)(p0.m_data + 1));
    FboTestCase::checkError((FboTestCase *)this);
    tcu::Vector<float,_3>::Vector
              ((Vector<float,_3> *)(p1.m_data + 1),(float)((uint)_format & 1) - 1.0,
               (float)(_format >> 1) - 1.0,0.0);
    tcu::Vector<float,_3>::Vector(&local_564,1.0,1.0,0.0);
    tcu::operator+((tcu *)local_558,(Vector<float,_3> *)(p1.m_data + 1),&local_564);
    sglr::ContextWrapper::glBindFramebuffer
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8d40,0);
    this_01 = &(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper;
    iVar5 = sglr::ContextWrapper::getWidth(this_01);
    iVar6 = sglr::ContextWrapper::getHeight
                      (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::ContextWrapper::glViewport(this_01,0,0,iVar5,iVar6);
    sglr::ContextWrapper::glActiveTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x84c0);
    sglr::ContextWrapper::glBindTexture
              (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper,0x8c1a,
               transferFmt.format);
    FboTestUtil::Texture2DArrayShader::setLayer((Texture2DArrayShader *)local_3c8,dataType);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    FboTestUtil::Texture2DArrayShader::setUniforms
              ((Texture2DArrayShader *)local_3c8,pCVar7,program_00);
    pCVar7 = sglr::ContextWrapper::getCurrentContext
                       (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
    sglr::drawQuad(pCVar7,program_00,(Vec3 *)(p1.m_data + 1),(Vec3 *)local_558);
    FboTestCase::checkError((FboTestCase *)this);
    tcu::TextureLevel::~TextureLevel((TextureLevel *)local_4b0);
    _format = _format + 1;
  }
  iVar5 = sglr::ContextWrapper::getWidth
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  iVar6 = sglr::ContextWrapper::getHeight
                    (&(this->super_FboColorbufferCase).super_FboTestCase.super_ContextWrapper);
  FboTestCase::readPixels((FboTestCase *)this,dst,0,0,iVar5,iVar6);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&n);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&transferFmt.dataType);
  FboTestUtil::Texture2DArrayShader::~Texture2DArrayShader((Texture2DArrayShader *)local_3c8);
  FboTestUtil::Texture2DShader::~Texture2DShader((Texture2DShader *)local_218);
  de::Random::~Random((Random *)&texFmt);
  return;
}

Assistant:

void render (tcu::Surface& dst)
	{
		de::Random				rnd					(deStringHash(getName()) ^ 0xed607a89);
		tcu::TextureFormat		texFmt				= glu::mapGLInternalFormat(m_format);
		tcu::TextureFormatInfo	fmtInfo				= tcu::getTextureFormatInfo(texFmt);

		Texture2DShader			texToFboShader		(DataTypes() << glu::TYPE_SAMPLER_2D, getFragmentOutputType(texFmt), fmtInfo.valueMax-fmtInfo.valueMin, fmtInfo.valueMin);
		Texture2DArrayShader	arrayTexShader		(glu::getSampler2DArrayType(texFmt), glu::TYPE_FLOAT_VEC4);

		deUint32				texToFboShaderID	= getCurrentContext()->createProgram(&texToFboShader);
		deUint32				arrayTexShaderID	= getCurrentContext()->createProgram(&arrayTexShader);

		// Setup textures
		texToFboShader.setUniforms(*getCurrentContext(), texToFboShaderID);
		arrayTexShader.setTexScaleBias(fmtInfo.lookupScale, fmtInfo.lookupBias);

		// Framebuffers.
		std::vector<deUint32>	fbos;
		deUint32				tex;

		{
			glu::TransferFormat		transferFmt		= glu::getTransferFormat(texFmt);
			bool					isFilterable	= glu::isGLInternalColorFormatFilterable(m_format);
			const IVec3&			size			= m_texSize;


			glGenTextures(1, &tex);

			glBindTexture(GL_TEXTURE_2D_ARRAY,		tex);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_WRAP_R,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_MIN_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexParameteri(GL_TEXTURE_2D_ARRAY,	GL_TEXTURE_MAG_FILTER,	isFilterable ? GL_LINEAR : GL_NEAREST);
			glTexImage3D(GL_TEXTURE_2D_ARRAY, 0, m_format, size.x(), size.y(), size.z(), 0, transferFmt.format, transferFmt.dataType, DE_NULL);

			// Generate an FBO for each layer
			for (int ndx = 0; ndx < m_texSize.z(); ndx++)
			{
				deUint32			layerFbo;

				glGenFramebuffers(1, &layerFbo);
				glBindFramebuffer(GL_FRAMEBUFFER, layerFbo);
				glFramebufferTextureLayer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, tex, 0, ndx);
				checkError();
				checkFramebufferStatus(GL_FRAMEBUFFER);

				fbos.push_back(layerFbo);
			}
		}

		// Render test images to random texture layers
		std::vector<int>		order;

		for (size_t n = 0; n < fbos.size(); n++)
			order.push_back((int)n);
		rnd.shuffle(order.begin(), order.end());

		for (size_t ndx = 0; ndx < order.size(); ndx++)
		{
			const int			layer		= order[ndx];
			const deUint32		format		= GL_RGBA;
			const deUint32		dataType	= GL_UNSIGNED_BYTE;
			const int			texW		= 128;
			const int			texH		= 128;
			deUint32			tmpTex		= 0;
			const deUint32		fbo			= fbos[layer];
			const IVec3&		viewport	= m_texSize;
			tcu::TextureLevel	data		(glu::mapGLTransferFormat(format, dataType), texW, texH, 1);

			tcu::fillWithGrid(data.getAccess(), 8, generateRandomColor(rnd), Vec4(0.0f));

			glGenTextures(1, &tmpTex);
			glBindTexture(GL_TEXTURE_2D, tmpTex);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MIN_FILTER,	GL_LINEAR);
			glTexParameteri(GL_TEXTURE_2D,	GL_TEXTURE_MAG_FILTER,	GL_LINEAR);
			glTexImage2D(GL_TEXTURE_2D, 0, format, texW, texH, 0, format, dataType, data.getAccess().getDataPtr());

			glBindFramebuffer(GL_FRAMEBUFFER, fbo);
			glViewport(0, 0, viewport.x(), viewport.y());
			sglr::drawQuad(*getCurrentContext(), texToFboShaderID, Vec3(-1.0f, -1.0f, 0.0f), Vec3(1.0f, 1.0f, 0.0f));
			checkError();

			// Render to framebuffer
			{
				const Vec3		p0	= Vec3(float(ndx % 2) - 1.0f, float(ndx / 2) - 1.0f, 0.0f);
				const Vec3		p1	= p0 + Vec3(1.0f, 1.0f, 0.0f);

				glBindFramebuffer(GL_FRAMEBUFFER, 0);
				glViewport(0, 0, getWidth(), getHeight());

				glActiveTexture(GL_TEXTURE0);
				glBindTexture(GL_TEXTURE_2D_ARRAY, tex);

				arrayTexShader.setLayer(layer);
				arrayTexShader.setUniforms(*getCurrentContext(), arrayTexShaderID);

				sglr::drawQuad(*getCurrentContext(), arrayTexShaderID, p0, p1);
				checkError();
			}
		}

		readPixels(dst, 0, 0, getWidth(), getHeight());
	}